

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3MatchSpanName(char *zSpan,char *zCol,char *zTab,char *zDb)

{
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  uchar uVar4;
  uchar uVar5;
  byte bVar6;
  ulong uVar7;
  byte *pbVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  
  uVar7 = 1;
  for (pbVar2 = (byte *)(zSpan + 1); (pbVar2[-1] != 0 && (pbVar2[-1] != 0x2e)); pbVar2 = pbVar2 + 1)
  {
    uVar7 = uVar7 + 1;
  }
  if (zDb == (char *)0x0) {
LAB_0018659f:
    uVar7 = 1;
    for (pbVar3 = pbVar2 + 2; (pbVar3[-2] != 0 && (pbVar3[-2] != 0x2e)); pbVar3 = pbVar3 + 1) {
      uVar7 = uVar7 + 1;
    }
    if (zTab != (char *)0x0) {
      if (uVar7 != 1) {
        uVar10 = uVar7 & 0xffffffff;
        pbVar8 = (byte *)zTab;
        do {
          if ((ulong)*pbVar2 == 0) {
            uVar5 = ""[*pbVar8];
            uVar4 = '\0';
LAB_0018660f:
            if (uVar4 != uVar5) goto LAB_0018661e;
            break;
          }
          uVar4 = ""[*pbVar2];
          uVar5 = ""[*pbVar8];
          if (uVar4 != uVar5) goto LAB_0018660f;
          pbVar2 = pbVar2 + 1;
          pbVar8 = pbVar8 + 1;
          uVar11 = (int)uVar10 - 1;
          uVar10 = (ulong)uVar11;
        } while (1 < uVar11);
      }
      if (zTab[uVar7 - 1] != '\0') goto LAB_0018661e;
    }
    if (zCol != (char *)0x0) {
      bVar6 = pbVar3[-1];
      if (bVar6 == 0) {
        uVar7 = 0;
      }
      else {
        do {
          uVar7 = (ulong)bVar6;
          if (""[bVar6] != ""[(byte)*zCol]) break;
          zCol = (char *)((byte *)zCol + 1);
          bVar6 = *pbVar3;
          pbVar3 = pbVar3 + 1;
          uVar7 = 0;
        } while (bVar6 != 0);
      }
      if (""[uVar7] != ""[(byte)*zCol]) {
        return 0;
      }
    }
    iVar1 = 1;
  }
  else {
    if (uVar7 != 1) {
      lVar9 = 0;
      uVar10 = uVar7 & 0xffffffff;
      do {
        if ((ulong)(byte)zSpan[lVar9] == 0) {
          uVar5 = ""[(byte)zDb[lVar9]];
          uVar4 = '\0';
LAB_0018658b:
          if (uVar4 != uVar5) goto LAB_0018661e;
          break;
        }
        uVar4 = ""[(byte)zSpan[lVar9]];
        uVar5 = ""[(byte)zDb[lVar9]];
        if (uVar4 != uVar5) goto LAB_0018658b;
        uVar11 = (int)uVar10 - 1;
        uVar10 = (ulong)uVar11;
        lVar9 = lVar9 + 1;
      } while (1 < uVar11);
    }
    if (zDb[uVar7 - 1] == '\0') goto LAB_0018659f;
LAB_0018661e:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3MatchSpanName(
  const char *zSpan,
  const char *zCol,
  const char *zTab,
  const char *zDb
){
  int n;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zDb && (sqlite3StrNICmp(zSpan, zDb, n)!=0 || zDb[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zTab && (sqlite3StrNICmp(zSpan, zTab, n)!=0 || zTab[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  if( zCol && sqlite3StrICmp(zSpan, zCol)!=0 ){
    return 0;
  }
  return 1;
}